

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.h
# Opt level: O3

QByteArray * __thiscall
QCborStreamReader::readAllUtf8String(QByteArray *__return_storage_ptr__,QCborStreamReader *this)

{
  QArrayData *data;
  bool bVar1;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  bVar1 = _readAndAppendToUtf8String_helper(this,__return_storage_ptr__);
  if (!bVar1) {
    data = &((__return_storage_ptr__->d).d)->super_QArrayData;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,1,0x10);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray readAllUtf8String()
    {
        QByteArray dst;
        if (!readAndAppendToUtf8String(dst))
            dst = QByteArray{};
        return dst;
    }